

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::AsmJsSlot>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,AsmJsSlot *value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  anon_union_8_7_4282efbc_for_AsmJsSlot_2 aVar2;
  BufferBuilder *pBVar3;
  ImmutableList<Js::BufferBuilder_*> *pIVar4;
  
  pBVar3 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x30,this->alloc,0x364470);
  pBVar3->clue = clue;
  pBVar3->offset = 0xffffffff;
  pBVar3->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dda68;
  aVar2 = value->field_2;
  pBVar3[1]._vptr_BufferBuilder = *(_func_int ***)value;
  pBVar3[1].clue = (LPCWSTR)aVar2;
  *(undefined8 *)&pBVar3[1].offset = *(undefined8 *)&value->isConstVar;
  pBVar3->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dda48;
  pIVar1 = builder->list;
  pIVar4 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
  pIVar4->value = pBVar3;
  pIVar4->next = pIVar1;
  builder->list = pIVar4;
  return 0x18;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }